

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_read_pt_bitlen(lzh_stream *strm,wchar_t start,wchar_t end)

{
  lzh_dec *plVar1;
  wchar_t wVar2;
  lzh_br *br_00;
  uint local_3c;
  wchar_t local_38;
  wchar_t d;
  wchar_t i;
  wchar_t c;
  lzh_br *br;
  lzh_dec *ds;
  wchar_t end_local;
  wchar_t start_local;
  lzh_stream *strm_local;
  
  plVar1 = strm->ds;
  br_00 = &plVar1->br;
  local_38 = start;
  do {
    if (end <= local_38) {
      return local_38;
    }
    if ((((plVar1->br).cache_avail < L'\x03') && (wVar2 = lzh_br_fillup(strm,br_00), wVar2 == L'\0')
        ) && ((plVar1->br).cache_avail < L'\x03')) {
      return local_38;
    }
    d = (uint)(br_00->cache_buffer >> ((char)(plVar1->br).cache_avail - 3U & 0x3f)) & 7;
    if (d == L'\a') {
      if ((((plVar1->br).cache_avail < L'\r') && (wVar2 = lzh_br_fillup(strm,br_00), wVar2 == L'\0')
          ) && ((plVar1->br).cache_avail < L'\r')) {
        return local_38;
      }
      for (local_3c = (uint)(br_00->cache_buffer >> ((char)(plVar1->br).cache_avail - 0xdU & 0x3f))
                      & 0x1fff; (local_3c & 0x200) != 0; local_3c = local_3c << 1) {
        d = d + L'\x01';
      }
      if (L'\x10' < d) {
        return L'\xffffffff';
      }
      (plVar1->br).cache_avail = (plVar1->br).cache_avail - (d + L'\xfffffffd');
    }
    else {
      (plVar1->br).cache_avail = (plVar1->br).cache_avail + L'\xfffffffd';
    }
    (plVar1->pt).bitlen[local_38] = (uchar)d;
    (plVar1->pt).freq[d] = (plVar1->pt).freq[d] + L'\x01';
    local_38 = local_38 + L'\x01';
  } while( true );
}

Assistant:

static int
lzh_read_pt_bitlen(struct lzh_stream *strm, int start, int end)
{
	struct lzh_dec *ds = strm->ds;
	struct lzh_br * br = &(ds->br);
	int c, i;

	for (i = start; i < end;) {
		/*
		 *  bit pattern     the number we need
		 *     000           ->  0
		 *     001           ->  1
		 *     010           ->  2
		 *     ...
		 *     110           ->  6
		 *     1110          ->  7
		 *     11110         ->  8
		 *     ...
		 *     1111111111110 ->  16
		 */
		if (!lzh_br_read_ahead(strm, br, 3))
			return (i);
		if ((c = lzh_br_bits(br, 3)) == 7) {
			int d;
			if (!lzh_br_read_ahead(strm, br, 13))
				return (i);
			d = lzh_br_bits(br, 13);
			while (d & 0x200) {
				c++;
				d <<= 1;
			}
			if (c > 16)
				return (-1);/* Invalid data. */
			lzh_br_consume(br, c - 3);
		} else
			lzh_br_consume(br, 3);
		ds->pt.bitlen[i++] = c;
		ds->pt.freq[c]++;
	}
	return (i);
}